

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

double __thiscall Matrix::GetFrobeniusNorm(Matrix *this)

{
  pointer pvVar1;
  pointer pFVar2;
  vector<Fraction,_std::allocator<Fraction>_> *row;
  pointer pvVar3;
  Fraction *item;
  pointer a;
  double dVar4;
  Fraction result;
  Fraction local_40;
  Fraction local_38;
  
  Fraction::Fraction(&local_40);
  pvVar3 = (this->elements_).
           super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->elements_).
           super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar3 != pvVar1) {
    do {
      pFVar2 = (pvVar3->super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (a = (pvVar3->super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
               super__Vector_impl_data._M_start; a != pFVar2; a = a + 1) {
        local_38 = operator*(a,a);
        Fraction::operator+=(&local_40,&local_38);
      }
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
  }
  dVar4 = Fraction::ToDouble(&local_40);
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  return dVar4;
}

Assistant:

double Matrix::GetFrobeniusNorm() const {
    Fraction result;
    for (const auto& row : elements_) {
        for (const auto& item : row) {
            result += item * item;
        }
    }

    return sqrt(result.ToDouble());
}